

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_reply_handle(SftpReplyBuilder *srb,ptrlen handle)

{
  SftpReplyBuilderVtable *pSVar1;
  
  *(undefined1 *)&srb[-0xf].vt = 0;
  safefree(srb[-4].vt);
  pSVar1 = (SftpReplyBuilderVtable *)mkstr(handle);
  srb[-4].vt = pSVar1;
  srb[-3].vt = (SftpReplyBuilderVtable *)handle.len;
  return;
}

Assistant:

static void scp_reply_handle(SftpReplyBuilder *srb, ptrlen handle)
{
    ScpReplyReceiver *reply = container_of(srb, ScpReplyReceiver, srb);
    char *p;
    reply->err = false;
    sfree((void *)reply->handle.ptr);
    reply->handle.ptr = p = mkstr(handle);
    reply->handle.len = handle.len;
}